

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::FboTestUtil::DepthGradientShader::shadeFragments
          (DepthGradientShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  long lVar6;
  GenericVec4 *pGVar7;
  int fragNdx;
  int fragNdx_00;
  ulong uVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Vec4 coord;
  UVec4 uicolor;
  IVec4 icolor;
  Vec4 color;
  float local_a8;
  float local_a4;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Vec4 local_48;
  
  fVar3 = (this->u_minGradient->value).f;
  fVar4 = (this->u_maxGradient->value).f;
  local_48.m_data._0_8_ = *(undefined8 *)&this->u_color->value;
  local_48.m_data._8_8_ = *(undefined8 *)((long)&this->u_color->value + 8);
  castVectorSaturate<int>(&local_48);
  castVectorSaturate<unsigned_int>(&local_48);
  if (0 < numPackets) {
    local_78 = local_68;
    uStack_70 = uStack_60;
    local_88 = local_58;
    uStack_80 = uStack_50;
    local_98 = local_48.m_data[0];
    fStack_94 = local_48.m_data[1];
    fStack_90 = local_48.m_data[2];
    fStack_8c = local_48.m_data[3];
    iVar9 = 0;
    uVar8 = 0;
    do {
      fragNdx_00 = 0;
      do {
        rr::readTriangleVarying<float>((rr *)&local_a8,packets + uVar8,context,0,fragNdx_00);
        iVar1 = iVar9 + fragNdx_00;
        context->fragmentDepths[context->numSamples * iVar1] =
             (local_a8 + local_a4) * 0.5 * (fVar4 - fVar3) + fVar3;
        iVar5 = *(int *)&(this->super_ShaderProgram).field_0x154;
        if (iVar5 == 0x22) {
          pGVar7 = context->outputArray;
          lVar6 = (long)(iVar1 * context->numFragmentOutputs) << 4;
          fVar10 = (float)local_78;
          fVar11 = local_78._4_4_;
          fVar12 = (float)uStack_70;
          fVar13 = uStack_70._4_4_;
LAB_006a01fd:
          pfVar2 = (float *)((long)&pGVar7->v + lVar6);
          *pfVar2 = fVar10;
          pfVar2[1] = fVar11;
          pfVar2[2] = fVar12;
          pfVar2[3] = fVar13;
        }
        else {
          if (iVar5 == 0x1e) {
            pGVar7 = context->outputArray;
            lVar6 = (long)(iVar1 * context->numFragmentOutputs) << 4;
            fVar10 = (float)local_88;
            fVar11 = local_88._4_4_;
            fVar12 = (float)uStack_80;
            fVar13 = uStack_80._4_4_;
            goto LAB_006a01fd;
          }
          if (iVar5 == 4) {
            pGVar7 = context->outputArray;
            lVar6 = (long)(iVar1 * context->numFragmentOutputs) << 4;
            fVar10 = local_98;
            fVar11 = fStack_94;
            fVar12 = fStack_90;
            fVar13 = fStack_8c;
            goto LAB_006a01fd;
          }
        }
        fragNdx_00 = fragNdx_00 + 1;
      } while (fragNdx_00 != 4);
      uVar8 = uVar8 + 1;
      iVar9 = iVar9 + 4;
    } while (uVar8 != (uint)numPackets);
  }
  return;
}

Assistant:

void DepthGradientShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const float			gradientMin	(u_minGradient.value.f);
	const float			gradientMax	(u_maxGradient.value.f);
	const tcu::Vec4		color		(u_color.value.f4);
	const tcu::IVec4	icolor		(castVectorSaturate<deInt32>(color));
	const tcu::UVec4	uicolor		(castVectorSaturate<deUint32>(color));

	// running this shader without a depth buffer does not make any sense
	DE_ASSERT(context.fragmentDepths);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec4		coord	= rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
		const float			x		= coord.x();
		const float			y		= coord.y();
		const float			f0		= (x + y) * 0.5f;

		rr::writeFragmentDepth(context, packetNdx, fragNdx, 0, gradientMin + (gradientMax-gradientMin) * f0);

		if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
		else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
		else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
		else
			DE_ASSERT(DE_FALSE);
	}
}